

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<kj::Directory::Replacer<kj::File>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::replaceFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  ArrayDisposer **ppAVar1;
  long lVar2;
  undefined8 uVar3;
  AtomicRefcounted *refcounted;
  _func_int **pp_Var4;
  undefined4 in_register_0000000c;
  long lVar5;
  undefined8 *puVar6;
  char *pcVar7;
  Replacer<kj::File> *extraout_RDX;
  Replacer<kj::File> *extraout_RDX_00;
  Replacer<kj::File> *extraout_RDX_01;
  Replacer<kj::File> *pRVar8;
  undefined4 in_R8D;
  Directory *ptrCopy;
  Own<kj::Directory::Replacer<kj::File>_> OVar9;
  StringPtr name;
  Fault f;
  undefined1 local_48 [24];
  
  lVar5 = CONCAT44(in_register_0000000c,mode);
  puVar6 = (undefined8 *)path.parts.size_;
  name.content.ptr = path.parts.ptr;
  if (lVar5 == 1) {
    newInMemoryFile((kj *)local_48,(Clock *)name.content.ptr[2].content.ptr);
    pp_Var4 = (_func_int **)operator_new(0x48);
    uVar3 = local_48._8_8_;
    lVar5 = puVar6[1];
    if (lVar5 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*puVar6;
    }
    local_48._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var4 + 1) = in_R8D;
    *pp_Var4 = (_func_int *)&PTR_get_0046bc08;
    *(undefined1 *)((long)pp_Var4 + 0xc) = 0;
    LOCK();
    ppAVar1 = &((name.content.ptr)->content).disposer;
    *(int *)ppAVar1 = *(int *)ppAVar1 + 1;
    UNLOCK();
    pp_Var4[2] = (_func_int *)&((name.content.ptr)->content).size_;
    pp_Var4[3] = (_func_int *)name.content.ptr;
    heapString((String *)(pp_Var4 + 4),pcVar7,lVar5 + -1 + (ulong)(lVar5 == 0));
    pp_Var4[7] = (_func_int *)local_48._0_8_;
    pp_Var4[8] = (_func_int *)uVar3;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var4;
    pRVar8 = extraout_RDX_01;
  }
  else {
    if (lVar5 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x481,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      _::Debug::Fault::~Fault((Fault *)local_48);
    }
    else {
      lVar2 = puVar6[1];
      if (lVar2 == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (char *)*puVar6;
      }
      name.content.size_ = (size_t)pcVar7;
      tryGetParent((InMemoryDirectory *)local_48,name,(int)lVar2 + (uint)(lVar2 == 0));
      local_48._16_8_ = local_48._0_8_;
      if ((_func_int **)local_48._8_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_48._8_8_ + 0x70))
                  (this,local_48._8_8_,puVar6 + 3,lVar5 + -1,in_R8D);
        (**(code **)(((String *)local_48._16_8_)->content).ptr)
                  (local_48._16_8_,
                   (_func_int *)(*(long *)(*(_func_int **)local_48._8_8_ + -0x10) + local_48._8_8_))
        ;
        pRVar8 = extraout_RDX;
        goto LAB_0035ce50;
      }
    }
    newInMemoryFile((kj *)local_48,(Clock *)name.content.ptr[2].content.ptr);
    pp_Var4 = (_func_int **)operator_new(0x20);
    *(undefined4 *)(pp_Var4 + 1) = 3;
    *pp_Var4 = (_func_int *)&PTR_get_0046bc78;
    pp_Var4[2] = (_func_int *)local_48._0_8_;
    pp_Var4[3] = (_func_int *)local_48._8_8_;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var4;
    pRVar8 = extraout_RDX_00;
  }
LAB_0035ce50:
  OVar9.ptr = pRVar8;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to read the clock ref
      return heap<ReplacerImpl<File>>(*this, path[0],
          newInMemoryFile(impl.getWithoutLock().clock), mode);
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->replaceFile(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<File>>(newInMemoryFile(impl.getWithoutLock().clock));
  }